

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O3

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_3)

{
  pointer ppVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar3 = option::matches(&this->super_option,url,method);
  if (bVar3) {
    lVar4 = (long)this->select_[0];
    if (((lVar4 < 0) ||
        (ppVar1 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3) <=
        this->select_[0])) || ((long)ppVar1[lVar4].first == -1)) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
    }
    else {
      pcVar2 = (this->super_option).match_.begin_;
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,pcVar2 + ppVar1[lVar4].first,pcVar2 + ppVar1[lVar4].second);
    }
    lVar4 = (long)this->select_[1];
    if (((lVar4 < 0) ||
        (ppVar1 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3) <=
        this->select_[1])) || ((long)ppVar1[lVar4].first == -1)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
    }
    else {
      pcVar2 = (this->super_option).match_.begin_;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar2 + ppVar1[lVar4].first,pcVar2 + ppVar1[lVar4].second);
    }
    lVar4 = (long)this->select_[2];
    if (((lVar4 < 0) ||
        (ppVar1 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3) <=
        this->select_[2])) || ((long)ppVar1[lVar4].first == -1)) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
    }
    else {
      pcVar2 = (this->super_option).match_.begin_;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar2 + ppVar1[lVar4].first,pcVar2 + ppVar1[lVar4].second);
    }
    lVar4 = (long)this->select_[3];
    if (((lVar4 < 0) ||
        (ppVar1 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3) <=
        this->select_[3])) || ((long)ppVar1[lVar4].first == -1)) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
    }
    else {
      pcVar2 = (this->super_option).match_.begin_;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,pcVar2 + ppVar1[lVar4].first,pcVar2 + ppVar1[lVar4].second);
    }
    lVar4 = (long)this->select_[4];
    if (((lVar4 < 0) ||
        (ppVar1 = (this->super_option).match_.offsets_.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (int)((ulong)((long)(this->super_option).match_.offsets_.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3) <=
        this->select_[4])) || ((long)ppVar1[lVar4].first == -1)) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
    }
    else {
      pcVar2 = (this->super_option).match_.begin_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,pcVar2 + ppVar1[lVar4].first,pcVar2 + ppVar1[lVar4].second);
    }
    if ((this->handle_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->handle_)._M_invoker)
              ((_Any_data *)&this->handle_,&local_30,&local_50,&local_70,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return bVar3;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}